

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_12,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined4 uVar1;
  int i;
  float *pfVar2;
  undefined1 *puVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  int col;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  Matrix<float,_4,_3> res;
  float afStack_c8 [6];
  float local_b0 [2];
  ulong local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38 [2];
  undefined8 uStack_30;
  undefined1 local_28 [4];
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  long lVar10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar2 = res_1.m_data;
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar12 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar12;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x30);
      lVar6 = lVar6 + 1;
      pfVar2 = pfVar2 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar6 != 3);
    res_1.m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    stack0xffffffffffffffa0 = CONCAT44(evalCtx->in[1].m_data[0],evalCtx->in[0].m_data[2]);
    local_58 = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    uStack_50 = *(undefined8 *)evalCtx->in[2].m_data;
    local_48 = CONCAT44(evalCtx->in[3].m_data[0],evalCtx->in[2].m_data[2]);
    uStack_40 = *(undefined8 *)(evalCtx->in[3].m_data + 1);
  }
  else {
    pfVar2 = res_1.m_data;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    stack0xffffffffffffffa0 = 0;
    puVar5 = &s_constInMat4x3;
    lVar4 = 0;
    do {
      lVar6 = 0;
      pfVar8 = pfVar2;
      do {
        ((Vector<float,_3> *)pfVar8)->m_data[0] = (float)puVar5[lVar6];
        lVar6 = lVar6 + 1;
        pfVar8 = (float *)((long)pfVar8 + 0xc);
      } while (lVar6 != 4);
      lVar4 = lVar4 + 1;
      pfVar2 = pfVar2 + 1;
      puVar5 = puVar5 + 4;
    } while (lVar4 != 3);
  }
  puVar3 = local_28;
  local_18 = 0;
  uStack_10 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  uStack_30 = 0;
  lVar4 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    auVar9 = _DAT_00ada920;
    do {
      bVar11 = SUB164(auVar9 ^ _DAT_00ad8f80,4) == -0x80000000 &&
               SUB164(auVar9 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar12 = 0;
        }
        *(undefined4 *)(puVar3 + lVar7 + -0x10) = uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar4 + -0x10 != lVar7) {
          uVar12 = 0;
        }
        *(undefined4 *)(puVar3 + lVar7) = uVar12;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x40);
    lVar6 = lVar6 + 1;
    lVar4 = lVar4 + 0x10;
    puVar3 = puVar3 + 4;
  } while (lVar6 != 4);
  lVar4 = 0;
  do {
    uVar12 = *(undefined4 *)((long)&uStack_50 + lVar4);
    uVar1 = *(undefined4 *)((long)&local_48 + lVar4 + 4);
    *(ulong *)(local_38 + lVar4) =
         CONCAT44(*(undefined4 *)((long)&fStack_5c + lVar4),
                  *(undefined4 *)((long)res_1.m_data + lVar4));
    *(ulong *)(local_28 + lVar4 * 4 + -8) = CONCAT44(uVar1,uVar12);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  res_2.m_data[0] = local_38[0];
  res_2.m_data[1] = local_38[1];
  res_2.m_data[2] = (float)uStack_30;
  local_88 = CONCAT44(uStack_20,uStack_24);
  local_80 = uStack_1c;
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  local_a8 = local_a8 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    local_b0[lVar4] = res_2.m_data[lVar4] + *(float *)((long)&local_88 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_98 = uStack_10;
  local_90 = (undefined4)local_18;
  afStack_c8[2] = 0.0;
  afStack_c8[3] = 0.0;
  afStack_c8[4] = 0.0;
  lVar4 = 0;
  do {
    afStack_c8[lVar4 + 2] = local_b0[lVar4] + *(float *)((long)&local_98 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a8 = 0x100000000;
  local_a0 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_b0[lVar4]] = afStack_c8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}